

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogExecution.cpp
# Opt level: O0

Expression * __thiscall wasm::LogExecution::makeLogCall(LogExecution *this,Expression *curr)

{
  initializer_list<wasm::Expression_*> __l;
  Name target;
  Index x;
  Builder right;
  Module *wasm;
  Call *left;
  Block *pBVar1;
  optional<wasm::Type> type;
  undefined1 local_98 [12];
  Type local_88 [3];
  allocator<wasm::Expression_*> local_69;
  Const *local_68;
  Const **local_60;
  size_type local_58;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_50;
  size_t local_38;
  char *pcStack_30;
  Builder local_20;
  Builder builder;
  Expression *curr_local;
  LogExecution *this_local;
  
  builder.wasm = (Module *)curr;
  wasm = Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>::getModule
                   (&(this->
                     super_WalkerPass<wasm::PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>_>
                     ).
                     super_PostWalker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>.
                     super_Walker<wasm::LogExecution,_wasm::Visitor<wasm::LogExecution,_void>_>);
  Builder::Builder(&local_20,wasm);
  x = makeLogCall::id;
  local_38 = LOGGER._0_8_;
  pcStack_30 = (char *)LOGGER._8_8_;
  makeLogCall::id = makeLogCall::id + 1;
  local_68 = Builder::makeConst<int>(&local_20,x);
  local_60 = &local_68;
  local_58 = 1;
  std::allocator<wasm::Expression_*>::allocator(&local_69);
  __l._M_len = local_58;
  __l._M_array = (iterator)local_60;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            (&local_50,__l,&local_69);
  wasm::Type::Type(local_88,none);
  target.super_IString.str._M_str = pcStack_30;
  target.super_IString.str._M_len = local_38;
  left = Builder::makeCall(&local_20,target,&local_50,local_88[0],false);
  right = builder;
  std::optional<wasm::Type>::optional((optional<wasm::Type> *)local_98);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._12_4_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)local_98._0_8_;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_engaged = (bool)local_98[8];
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._9_3_ = local_98._9_3_;
  pBVar1 = Builder::makeSequence(&local_20,(Expression *)left,(Expression *)right.wasm,type);
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_50);
  std::allocator<wasm::Expression_*>::~allocator(&local_69);
  return (Expression *)pBVar1;
}

Assistant:

Expression* makeLogCall(Expression* curr) {
    static Index id = 0;
    Builder builder(*getModule());
    return builder.makeSequence(
      builder.makeCall(LOGGER, {builder.makeConst(int32_t(id++))}, Type::none),
      curr);
  }